

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

double __thiscall
ProbabEstimator::getProbabGt
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  undefined1 auVar1 [16];
  DistribFunction *this_00;
  int i;
  int k;
  int exp;
  double base;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 extraout_var [56];
  
  this_00 = this->distribFunction;
  base = DistribFunction::getDistrib(this_00,minValInRetained);
  auVar5 = ZEXT816(0x3ff0000000000000);
  k = 0;
  exp = pathLength;
  while (k <= numReplaced) {
    dVar2 = combNumber((ProbabEstimator *)this_00,pathLength,k);
    dVar3 = pown((ProbabEstimator *)this_00,1.0 - base,k);
    auVar4._0_8_ = pown((ProbabEstimator *)this_00,base,exp);
    auVar4._8_56_ = extraout_var;
    auVar5._8_8_ = 0;
    k = k + 1;
    exp = exp + -1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar3 * dVar2;
    auVar5 = vfnmadd231sd_fma(auVar5,auVar4._0_16_,auVar1);
  }
  return auVar5._0_8_;
}

Assistant:

double ProbabEstimator::getProbabGt( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib(minValInRetained);
    double cPAr = 1.0-PAr;

    double val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ){
        val -= (double)combNumber( pathLength, i )*pown( cPAr, i )*pown(PAr, (pathLength-i));
    }

    return val;
}